

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPart.c
# Opt level: O0

void Abc_NtkFraigPartitionedTime(Abc_Ntk_t *pNtk,void *pParams)

{
  int iVar1;
  uint uVar2;
  abctime aVar3;
  Vec_Ptr_t *p;
  Abc_Frame_t *pAVar4;
  Vec_Ptr_t *vOutsPtr;
  Vec_Ptr_t *p_00;
  Vec_Int_t *vOuts;
  Abc_Ntk_t *Entry;
  Abc_Ntk_t *pAVar5;
  abctime aVar6;
  abctime clk;
  int i;
  Abc_Ntk_t *pNtkFraig;
  Abc_Ntk_t *pNtkAig;
  Vec_Int_t *vOne;
  Vec_Ptr_t *vOnePtr;
  Vec_Ptr_t *vFraigs;
  Vec_Ptr_t *vParts;
  void *pParams_local;
  Abc_Ntk_t *pNtk_local;
  
  aVar3 = Abc_Clock();
  iVar1 = Abc_NtkIsStrash(pNtk);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcPart.c"
                  ,0x491,"void Abc_NtkFraigPartitionedTime(Abc_Ntk_t *, void *)");
  }
  p = Abc_NtkPartitionSmart(pNtk,300,0);
  pAVar4 = Abc_FrameGetGlobalFrame();
  Cmd_CommandExecute(pAVar4,"unset progressbar");
  vOutsPtr = Vec_PtrAlloc(1000);
  iVar1 = Vec_PtrSize(p);
  p_00 = Vec_PtrAlloc(iVar1);
  for (clk._4_4_ = 0; iVar1 = Vec_PtrSize(p), clk._4_4_ < iVar1; clk._4_4_ = clk._4_4_ + 1) {
    vOuts = (Vec_Int_t *)Vec_PtrEntry(p,clk._4_4_);
    Abc_NtkConvertCos(pNtk,vOuts,vOutsPtr);
    pAVar5 = Abc_NtkCreateConeArray(pNtk,vOutsPtr,0);
    Entry = Abc_NtkFraig(pAVar5,pParams,0,0);
    Vec_PtrPush(p_00,Entry);
    Abc_NtkDelete(pAVar5);
    uVar2 = Vec_PtrSize(p);
    printf("Finished part %5d (out of %5d)\r",(ulong)(clk._4_4_ + 1),(ulong)uVar2);
  }
  Vec_VecFree((Vec_Vec_t *)p);
  pAVar4 = Abc_FrameGetGlobalFrame();
  Cmd_CommandExecute(pAVar4,"set progressbar");
  for (clk._4_4_ = 0; iVar1 = Vec_PtrSize(p_00), clk._4_4_ < iVar1; clk._4_4_ = clk._4_4_ + 1) {
    pAVar5 = (Abc_Ntk_t *)Vec_PtrEntry(p_00,clk._4_4_);
    Abc_NtkDelete(pAVar5);
  }
  Vec_PtrFree(p_00);
  Vec_PtrFree(vOutsPtr);
  Abc_Print(1,"%s =","Partitioned fraiging time");
  aVar6 = Abc_Clock();
  Abc_Print(1,"%9.2f sec\n",((double)(aVar6 - aVar3) * 1.0) / 1000000.0);
  return;
}

Assistant:

void Abc_NtkFraigPartitionedTime( Abc_Ntk_t * pNtk, void * pParams )
{
    Vec_Ptr_t * vParts, * vFraigs, * vOnePtr;
    Vec_Int_t * vOne;
    Abc_Ntk_t * pNtkAig, * pNtkFraig;
    int i;
    abctime clk = Abc_Clock();

    // perform partitioning
    assert( Abc_NtkIsStrash(pNtk) );
//    vParts = Abc_NtkPartitionNaive( pNtk, 20 );
    vParts = Abc_NtkPartitionSmart( pNtk, 300, 0 );

    Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), "unset progressbar" );

    // fraig each partition
    vOnePtr = Vec_PtrAlloc( 1000 );
    vFraigs = Vec_PtrAlloc( Vec_PtrSize(vParts) );
    Vec_PtrForEachEntry( Vec_Int_t *, vParts, vOne, i )
    {
        Abc_NtkConvertCos( pNtk, vOne, vOnePtr );
        pNtkAig = Abc_NtkCreateConeArray( pNtk, vOnePtr, 0 );
        pNtkFraig = Abc_NtkFraig( pNtkAig, pParams, 0, 0 );
        Vec_PtrPush( vFraigs, pNtkFraig );
        Abc_NtkDelete( pNtkAig );

        printf( "Finished part %5d (out of %5d)\r", i+1, Vec_PtrSize(vParts) );
    }
    Vec_VecFree( (Vec_Vec_t *)vParts );

    Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), "set progressbar" );

    // derive the final network
    Vec_PtrForEachEntry( Abc_Ntk_t *, vFraigs, pNtkAig, i )
        Abc_NtkDelete( pNtkAig );
    Vec_PtrFree( vFraigs );
    Vec_PtrFree( vOnePtr );
    ABC_PRT( "Partitioned fraiging time", Abc_Clock() - clk );
}